

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::BaseAtomVisitor::setVisited(BaseAtomVisitor *this,Atom *atom)

{
  element_type *peVar1;
  shared_ptr<OpenMD::GenericData> data;
  allocator<char> local_69;
  __shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> local_50 [2];
  undefined1 local_30 [16];
  __shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_68._M_ptr = (element_type *)0x0;
  local_68._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"VISITED",&local_69);
  StuntDouble::getPropertyByName((StuntDouble *)local_30,(string *)atom);
  std::__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_68,(__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 8));
  std::__cxx11::string::~string((string *)local_50);
  if (local_68._M_ptr == (element_type *)0x0) {
    std::make_shared<OpenMD::GenericData>();
    std::__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_68,local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50[0]._M_refcount);
    peVar1 = local_68._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,"VISITED",(allocator<char> *)local_30);
    std::__cxx11::string::_M_assign((string *)&peVar1->id_);
    std::__cxx11::string::~string((string *)local_50);
    std::__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_20,&local_68);
    StuntDouble::addProperty(&atom->super_StuntDouble,(shared_ptr<OpenMD::GenericData> *)&local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  return;
}

Assistant:

void BaseAtomVisitor::setVisited(Atom* atom) {
    std::shared_ptr<GenericData> data;
    data = atom->getPropertyByName("VISITED");

    // if visited property is not existed, add it as new property
    if (data == nullptr) {
      data = std::make_shared<GenericData>();
      data->setID("VISITED");
      atom->addProperty(data);
    }
  }